

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmilankoviccalendar.cpp
# Opt level: O2

QStringList * QMilankovicCalendar::nameList(void)

{
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  initializer_list<QString> args;
  QArrayDataPointer<char16_t> local_40;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d = (Data *)0x0;
  local_40.d = (Data *)0x0;
  local_40.ptr = (char16_t *)0x0;
  local_28.ptr = L"Milankovic";
  local_40.size = 0;
  local_28.size = 10;
  args._M_len = 1;
  args._M_array = (iterator)&local_28;
  QList<QString>::QList(in_RDI,args);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QMilankovicCalendar::nameList()
{
    return { QStringLiteral("Milankovic") };
}